

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::testCaseEnded(JunitReporter *this,TestCaseStats *testCaseStats)

{
  long in_RSI;
  long in_RDI;
  TestCaseStats *in_stack_00000028;
  CumulativeReporterBase<Catch::JunitReporter> *in_stack_00000030;
  
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x128),(string *)(in_RSI + 0xe8));
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x148),(string *)(in_RSI + 0x108));
  CumulativeReporterBase<Catch::JunitReporter>::testCaseEnded(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

void JunitReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        stdOutForSuite += testCaseStats.stdOut;
        stdErrForSuite += testCaseStats.stdErr;
        CumulativeReporterBase::testCaseEnded( testCaseStats );
    }